

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  float fVar1;
  bool bVar2;
  ImGuiStyle *pIVar3;
  float fVar4;
  float local_28;
  ImVec2 local_24;
  ImVec2 size;
  float height_in_items_f;
  int height_in_items_local;
  int items_count_local;
  char *label_local;
  
  size.y = (float)height_in_items;
  if (height_in_items < 0) {
    size.y = (float)ImMin<int>(items_count,7);
  }
  if ((int)size.y < items_count) {
    local_28 = (float)(int)size.y + 0.4;
  }
  else {
    local_28 = (float)(int)size.y + 0.0;
  }
  size.x = local_28;
  ImVec2::ImVec2(&local_24);
  local_24.x = 0.0;
  fVar4 = GetTextLineHeightWithSpacing();
  fVar1 = size.x;
  pIVar3 = GetStyle();
  local_24.y = fVar4 * fVar1 + (pIVar3->ItemSpacing).y;
  bVar2 = ListBoxHeader(label,&local_24);
  return bVar2;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    // We don't add +0.40f if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items < items_count ? (height_in_items + 0.40f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + GetStyle().ItemSpacing.y;
    return ListBoxHeader(label, size);
}